

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O1

void device_cancel(nni_aio *aio,void *arg,int rv)

{
  long lVar1;
  nni_aio *aio_00;
  
  nni_mtx_lock(&device_mtx);
  if ((*arg == aio) && (0 < *(int *)((long)arg + 8))) {
    aio_00 = (nni_aio *)((long)arg + 0x38);
    lVar1 = 0;
    do {
      nni_aio_abort(aio_00,rv);
      lVar1 = lVar1 + 1;
      aio_00 = (nni_aio *)&aio_00[1].a_task;
    } while (lVar1 < *(int *)((long)arg + 8));
  }
  nni_mtx_unlock(&device_mtx);
  return;
}

Assistant:

static void
device_cancel(nni_aio *aio, void *arg, int rv)
{
	device_data *d = arg;
	// cancellation is the only path to shutting it down.

	nni_mtx_lock(&device_mtx);
	if (d->user == aio) {
		for (int i = 0; i < d->num_paths; i++) {
			nni_aio_abort(&d->paths[i].aio, rv);
		}
	}
	nni_mtx_unlock(&device_mtx);
}